

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O3

int OPENSSL_tm_to_posix(tm *tm,int64_t *out)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  int iVar11;
  short sVar12;
  long lVar13;
  
  uVar1 = (long)tm->tm_year + 0x76c;
  iVar10 = 0;
  iVar11 = 0;
  if (uVar1 < 10000) {
    uVar2 = tm->tm_mon;
    iVar11 = 0;
    if (((-1 < (int)uVar2) && (uVar3 = tm->tm_mday, iVar11 = iVar10, 0 < (int)uVar3)) &&
       (uVar2 < 0xc)) {
      uVar4 = tm->tm_hour;
      uVar5 = tm->tm_min;
      uVar6 = tm->tm_sec;
      if ((0xad5U >> (uVar2 & 0x1f) & 1) == 0) {
        if ((0x528U >> (uVar2 & 0x1f) & 1) == 0) {
          sVar7 = (short)uVar1;
          if (((ushort)((ushort)(sVar7 * 0x5c29) >> 4 | sVar7 * -0x7000) < 0xa4) ||
             (((long)tm->tm_year & 3U) == 0 &&
              0x28f < (ushort)((ushort)(sVar7 * 0x5c29) >> 2 | sVar7 * 0x4000))) {
            if (0x1d < uVar3) {
              return 0;
            }
          }
          else if (0x1c < uVar3) {
            return 0;
          }
        }
        else if (0x1e < uVar3) {
          return 0;
        }
      }
      else if (0x1f < uVar3) {
        return 0;
      }
      if ((((int)uVar6 < 0x3c) && ((int)uVar5 < 0x3c)) &&
         (((int)uVar4 < 0x18 && (-1 < (int)(uVar5 | uVar4 | uVar6))))) {
        lVar13 = uVar1 - ((long)(int)uVar2 + 1U < 3);
        sVar7 = (short)uVar2 + -2;
        if ((long)(int)uVar2 + 1U < 3) {
          sVar7 = (short)uVar2 + 10;
        }
        sVar9 = (short)lVar13 + -399;
        if (-1 < lVar13) {
          sVar9 = (short)lVar13;
        }
        lVar13 = (long)((int)sVar9 / 400) * -400 + lVar13;
        sVar8 = (short)lVar13;
        sVar12 = sVar8 + 3;
        if (-1 < sVar8) {
          sVar12 = sVar8;
        }
        *out = (long)(int)uVar5 * 0x3c + (long)(int)uVar4 * 0xe10 + (long)(int)uVar6 + -0xe79256200
               + ((ulong)(uVar3 - 1) + (long)((int)(short)(sVar7 * 0x99 + 2) / 5) +
                  (long)((int)sVar9 / 400) * 0x23ab1 + lVar13 * 0x16d +
                  (long)(short)((uint)(int)sVar12 >> 2) +
                 (long)((sVar8 * -0x147b >> 0x13) - (sVar8 * -0x147b >> 0x1f))) * 0x15180;
        iVar11 = 1;
      }
    }
  }
  return iVar11;
}

Assistant:

int OPENSSL_tm_to_posix(const struct tm *tm, int64_t *out) {
  return posix_time_from_utc(tm->tm_year + INT64_C(1900),
                             tm->tm_mon + INT64_C(1), tm->tm_mday, tm->tm_hour,
                             tm->tm_min, tm->tm_sec, out);
}